

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O2

int Curl_HMAC_final(HMAC_context *ctxt,uchar *result)

{
  HMAC_params *pHVar1;
  
  pHVar1 = ctxt->hmac_hash;
  if (result == (uchar *)0x0) {
    result = (uchar *)((ulong)pHVar1->hmac_ctxtsize + (long)ctxt->hmac_hashctxt2);
  }
  (*pHVar1->hmac_hfinal)(result,ctxt->hmac_hashctxt1);
  (*pHVar1->hmac_hupdate)(ctxt->hmac_hashctxt2,result,pHVar1->hmac_resultlen);
  (*pHVar1->hmac_hfinal)(result,ctxt->hmac_hashctxt2);
  (*Curl_cfree)(ctxt);
  return 0;
}

Assistant:

int Curl_HMAC_final(HMAC_context *ctxt, unsigned char *result)
{
  const HMAC_params * hashparams = ctxt->hmac_hash;

  /* Do not get result if called with a null parameter: only release
     storage. */

  if(!result)
    result = (unsigned char *) ctxt->hmac_hashctxt2 +
     ctxt->hmac_hash->hmac_ctxtsize;

  (*hashparams->hmac_hfinal)(result, ctxt->hmac_hashctxt1);
  (*hashparams->hmac_hupdate)(ctxt->hmac_hashctxt2,
   result, hashparams->hmac_resultlen);
  (*hashparams->hmac_hfinal)(result, ctxt->hmac_hashctxt2);
  free((char *) ctxt);
  return 0;
}